

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMove7<(moira::Instr)71,(moira::Mode)9,(moira::Size)4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Ea<(moira::Mode)7,_(moira::Size)4> dst;
  Ea<(moira::Mode)9,_(moira::Size)4> src;
  Ea<(moira::Mode)7,_(moira::Size)4> local_58;
  Ea<(moira::Mode)9,_(moira::Size)4> local_44;
  
  local_44.reg = op & 7;
  local_44.pc = *addr;
  local_44.ext1 = dasmRead<(moira::Size)2>(this,addr);
  local_58.reg = op >> 9 & 7;
  local_58.pc = *addr;
  local_58.ext1 = dasmRead<(moira::Size)2>(this,addr);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)(this->tab).raw);
  pSVar1 = StrWriter::operator<<(pSVar1,&local_44);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<(pSVar1,&local_58);
  return;
}

Assistant:

void
Moira::dasmMove7(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_AW,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}